

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O0

void __thiscall
mp::internal::TextReader<fmt::Locale>::TextReader
          (TextReader<fmt::Locale> *this,NLStringRef data,CStringRef name)

{
  NLStringRef data_00;
  ReaderBase *in_RCX;
  char *in_RDX;
  CStringRef in_RSI;
  undefined8 *in_RDI;
  size_t unaff_retaddr;
  
  data_00.size_ = unaff_retaddr;
  data_00.data_ = in_RDX;
  ReaderBase::ReaderBase(in_RCX,data_00,in_RSI);
  in_RDI[8] = *in_RDI;
  *(undefined4 *)(in_RDI + 9) = 1;
  CopyableLocale::CopyableLocale((CopyableLocale *)0x1e7e04);
  return;
}

Assistant:

mp::internal::TextReader<Locale>::TextReader(
    NLStringRef data, fmt::CStringRef name)
: ReaderBase(data, name), line_start_(ptr_), line_(1) {}